

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_password_ex
              (LIBSSH2_SESSION *session,char *username,uint username_len,char *password,
              uint password_len,
              _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb)

{
  size_t *data_len;
  uchar **data;
  int iVar1;
  libssh2_nonblocking_states lVar2;
  uchar *puVar3;
  char *errmsg;
  bool bVar4;
  uchar *local_98;
  ulong local_90;
  char *local_88;
  ulong local_80;
  uchar *local_78;
  _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *local_70;
  ulong local_68;
  size_t local_60;
  ulong local_58;
  int *local_50;
  char **local_48;
  packet_requirev_state_t *local_40;
  time_t local_38;
  
  local_88 = username;
  local_78 = (uchar *)password;
  local_70 = passwd_change_cb;
  local_38 = time((time_t *)0x0);
  local_40 = &session->userauth_pswd_packet_requirev_state;
  local_60 = (size_t)(username_len + 0x28);
  data_len = &session->userauth_pswd_data_len;
  data = &session->userauth_pswd_data;
  local_48 = &session->userauth_pswd_newpw;
  local_50 = &session->userauth_pswd_newpw_len;
  local_58 = (ulong)(username_len + password_len + 0x2c);
  local_90 = (ulong)username_len;
  local_80 = (ulong)password_len;
  local_68 = (ulong)password_len;
LAB_00128316:
  lVar2 = session->userauth_pswd_state;
  if (lVar2 == libssh2_NB_state_created) {
LAB_001283ce:
    iVar1 = _libssh2_transport_send
                      (session,session->userauth_pswd_data,session->userauth_pswd_data_len,local_78,
                       local_80);
    if (iVar1 == -0x25) {
      iVar1 = -0x25;
      errmsg = "Would block writing password request";
    }
    else {
      (*session->free)(session->userauth_pswd_data,&session->abstract);
      session->userauth_pswd_data = (uchar *)0x0;
      if (iVar1 == 0) {
        session->userauth_pswd_state = libssh2_NB_state_sent;
        lVar2 = libssh2_NB_state_sent;
LAB_001284a7:
        bVar4 = lVar2 == libssh2_NB_state_sent;
        do {
          if (bVar4) {
            iVar1 = _libssh2_packet_requirev(session,"43<",data,data_len,0,(uchar *)0x0,0,local_40);
            if (iVar1 != 0) {
              if (iVar1 != -0x25) {
                session->userauth_pswd_state = libssh2_NB_state_idle;
              }
              errmsg = "Waiting for password response";
              goto LAB_001287c1;
            }
            if (*data_len == 0) goto LAB_001286fc;
            puVar3 = *data;
            if (*puVar3 == '3') {
              (*session->free)(puVar3,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0x12;
              errmsg = "Authentication failed (username/password)";
              goto LAB_001287c1;
            }
            if (*puVar3 == '4') {
              (*session->free)(puVar3,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              *(byte *)&session->state = (byte)session->state | 4;
              session->userauth_pswd_state = libssh2_NB_state_idle;
              return 0;
            }
            session->userauth_pswd_newpw = (char *)0x0;
            session->userauth_pswd_newpw_len = 0;
            session->userauth_pswd_state = libssh2_NB_state_sent1;
            lVar2 = libssh2_NB_state_sent1;
          }
          else {
            if (*data_len == 0) {
LAB_001286fc:
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0xe;
              errmsg = "Unexpected packet size";
              goto LAB_001287c1;
            }
            puVar3 = *data;
          }
          if ((*puVar3 != '<') && (session->userauth_pswd_data0 != '<')) goto LAB_00128416;
          session->userauth_pswd_data0 = '<';
          if ((lVar2 & ~libssh2_NB_state_allocated) != libssh2_NB_state_sent1) {
            session->userauth_pswd_state = libssh2_NB_state_idle;
            iVar1 = -0xf;
            errmsg = "Password Expired, and no callback specified";
            goto LAB_001287c1;
          }
          if (lVar2 == libssh2_NB_state_sent1) {
            (*session->free)(puVar3,&session->abstract);
            session->userauth_pswd_data = (uchar *)0x0;
            puVar3 = (uchar *)0x0;
          }
          if (local_70 == (_func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *)0x0)
          goto LAB_00128416;
          if (session->userauth_pswd_state != libssh2_NB_state_sent2) {
            if (session->userauth_pswd_state != libssh2_NB_state_sent1) goto LAB_00128416;
            (*local_70)(session,local_48,local_50,&session->abstract);
            if (session->userauth_pswd_newpw == (char *)0x0) {
              iVar1 = -0xf;
              errmsg = "Password expired, and callback failed";
              goto LAB_001287c1;
            }
            session->userauth_pswd_data_len = local_58;
            local_98 = (uchar *)(*session->alloc)(local_58,&session->abstract);
            session->userauth_pswd_data = local_98;
            if (local_98 == (uchar *)0x0) {
              (*session->free)(session->userauth_pswd_newpw,&session->abstract);
              session->userauth_pswd_newpw = (char *)0x0;
              iVar1 = -6;
              errmsg = "Unable to allocate memory for userauth password change request";
              goto LAB_001287c1;
            }
            *local_98 = '2';
            local_98 = local_98 + 1;
            _libssh2_store_str(&local_98,local_88,local_90);
            _libssh2_store_str(&local_98,"ssh-connection",0xe);
            _libssh2_store_str(&local_98,"password",8);
            *local_98 = '\x01';
            local_98 = local_98 + 1;
            _libssh2_store_str(&local_98,(char *)local_78,local_80);
            _libssh2_store_u32(&local_98,session->userauth_pswd_newpw_len);
            session->userauth_pswd_state = libssh2_NB_state_sent2;
            puVar3 = session->userauth_pswd_data;
          }
          iVar1 = _libssh2_transport_send
                            (session,puVar3,session->userauth_pswd_data_len,
                             (uchar *)session->userauth_pswd_newpw,
                             (long)session->userauth_pswd_newpw_len);
          if (iVar1 == -0x25) {
            iVar1 = -0x25;
            errmsg = "Would block waiting";
            goto LAB_001287c1;
          }
          (*session->free)(session->userauth_pswd_data,&session->abstract);
          session->userauth_pswd_data = (uchar *)0x0;
          (*session->free)(session->userauth_pswd_newpw,&session->abstract);
          session->userauth_pswd_newpw = (char *)0x0;
          if (iVar1 != 0) goto LAB_00128749;
          session->userauth_pswd_state = libssh2_NB_state_sent;
          bVar4 = true;
          lVar2 = libssh2_NB_state_sent;
        } while( true );
      }
      session->userauth_pswd_state = libssh2_NB_state_idle;
      iVar1 = -7;
      errmsg = "Unable to send userauth-password request";
    }
  }
  else if (lVar2 == libssh2_NB_state_idle) {
    (session->userauth_pswd_packet_requirev_state).start = 0;
    session->userauth_pswd_data_len = local_60;
    session->userauth_pswd_data0 = 0xc3;
    puVar3 = (uchar *)(*session->alloc)(local_60,&session->abstract);
    session->userauth_pswd_data = puVar3;
    if (puVar3 != (uchar *)0x0) {
      local_98 = puVar3 + 1;
      *puVar3 = '2';
      _libssh2_store_str(&local_98,local_88,local_90);
      _libssh2_store_str(&local_98,"ssh-connection",0xe);
      _libssh2_store_str(&local_98,"password",8);
      *local_98 = '\0';
      local_98 = local_98 + 1;
      _libssh2_store_u32(&local_98,(uint32_t)local_68);
      session->userauth_pswd_state = libssh2_NB_state_created;
      goto LAB_001283ce;
    }
    iVar1 = -6;
    errmsg = "Unable to allocate memory for userauth-password request";
  }
  else {
    if (lVar2 - libssh2_NB_state_sent < 3) goto LAB_001284a7;
    puVar3 = *data;
LAB_00128416:
    (*session->free)(puVar3,&session->abstract);
    session->userauth_pswd_data = (uchar *)0x0;
    session->userauth_pswd_state = libssh2_NB_state_idle;
    iVar1 = -0x12;
    errmsg = "Authentication failed";
  }
  goto LAB_001287c1;
LAB_00128749:
  iVar1 = -7;
  errmsg = "Unable to send userauth password-change request";
LAB_001287c1:
  iVar1 = _libssh2_error(session,iVar1,errmsg);
  if (iVar1 != -0x25) {
    return iVar1;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar1 = _libssh2_wait_socket(session,local_38);
  if (iVar1 != 0) {
    return iVar1;
  }
  goto LAB_00128316;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_password_ex(LIBSSH2_SESSION *session, const char *username,
                             unsigned int username_len, const char *password,
                             unsigned int password_len,
                             LIBSSH2_PASSWD_CHANGEREQ_FUNC
                             ((*passwd_change_cb)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_password(session, username, username_len,
                                   (unsigned char *)password, password_len,
                                   passwd_change_cb));
    return rc;
}